

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conncache.c
# Opt level: O3

CURLcode Curl_conncache_add_conn(Curl_easy *data)

{
  connectdata *conn;
  conncache *connc;
  conncache *h;
  size_t sVar1;
  long lVar2;
  connectbundle *p;
  size_t key_len;
  void *pvVar3;
  size_t len;
  CURLcode CVar4;
  char key [128];
  char acStack_b8 [136];
  
  conn = data->conn;
  connc = (data->state).conn_cache;
  p = Curl_conncache_find_bundle(data,conn,connc);
  if (p == (connectbundle *)0x0) {
    p = (connectbundle *)(*Curl_cmalloc)(0x30);
    if (p != (connectbundle *)0x0) {
      p->num_connections = 0;
      p->multiuse = 0;
      Curl_llist_init(&p->conn_list,conn_llist_dtor);
      hashkey(conn,acStack_b8,len);
      h = (data->state).conn_cache;
      key_len = strlen(acStack_b8);
      pvVar3 = Curl_hash_add(&h->hash,acStack_b8,key_len,p);
      if (pvVar3 != (void *)0x0) goto LAB_00521c07;
      Curl_llist_destroy(&p->conn_list,(void *)0x0);
      (*Curl_cfree)(p);
    }
    CVar4 = CURLE_OUT_OF_MEMORY;
  }
  else {
LAB_00521c07:
    Curl_llist_insert_next(&p->conn_list,(p->conn_list).tail,conn,&conn->bundle_node);
    conn->bundle = p;
    p->num_connections = p->num_connections + 1;
    sVar1 = connc->num_conn;
    lVar2 = connc->next_connection_id;
    conn->connection_id = lVar2;
    connc->num_conn = sVar1 + 1;
    connc->next_connection_id = lVar2 + 1;
    CVar4 = CURLE_OK;
  }
  if (data->share != (Curl_share *)0x0) {
    Curl_share_unlock(data,CURL_LOCK_DATA_CONNECT);
  }
  return CVar4;
}

Assistant:

CURLcode Curl_conncache_add_conn(struct Curl_easy *data)
{
  CURLcode result = CURLE_OK;
  struct connectbundle *bundle = NULL;
  struct connectdata *conn = data->conn;
  struct conncache *connc = data->state.conn_cache;
  DEBUGASSERT(conn);

  /* *find_bundle() locks the connection cache */
  bundle = Curl_conncache_find_bundle(data, conn, data->state.conn_cache);
  if(!bundle) {
    char key[HASHKEY_SIZE];

    result = bundle_create(&bundle);
    if(result) {
      goto unlock;
    }

    hashkey(conn, key, sizeof(key));

    if(!conncache_add_bundle(data->state.conn_cache, key, bundle)) {
      bundle_destroy(bundle);
      result = CURLE_OUT_OF_MEMORY;
      goto unlock;
    }
  }

  bundle_add_conn(bundle, conn);
  conn->connection_id = connc->next_connection_id++;
  connc->num_conn++;

  DEBUGF(infof(data, "Added connection %ld. "
               "The cache now contains %zu members",
               conn->connection_id, connc->num_conn));

  unlock:
  CONNCACHE_UNLOCK(data);

  return result;
}